

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::ControlFlowWalker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_>::scan
               (JumpThreader *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  Expression *curr;
  Expression **currp_local;
  JumpThreader *self_local;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  if ((IVar1 - BlockId < 3) || (IVar1 == TryId)) {
    Walker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_>::pushTask
              ((Walker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_> *)self,
               doPostVisitControlFlow,currp);
  }
  PostWalker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_>::scan(self,currp);
  IVar1 = pEVar2->_id;
  if ((IVar1 - BlockId < 3) || (IVar1 == TryId)) {
    Walker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_>::pushTask
              ((Walker<JumpThreader,_wasm::Visitor<JumpThreader,_void>_> *)self,
               doPreVisitControlFlow,currp);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }